

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_interface.h
# Opt level: O2

void katherine_cmd_long(char *cmd,long value)

{
  for (; 0 < value; value = (ulong)value >> 8) {
    *cmd = (char)value;
    cmd = cmd + 1;
  }
  return;
}

Assistant:

static inline void
katherine_cmd_long(char *cmd, long value)
{
    int i = 0;
    int mlsb, mmsb;
    while (value > 0) {
        mlsb = (0x0f) & (int) (value % 16);
        value /= 16;

        mmsb = (0x0f) & (int) (value % 16);
        value /= 16;

        cmd[i++] = (char) ((0xff & mlsb) | (0xff & mmsb) << 4);
    }
}